

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O2

void __thiscall
duckdb::StandardColumnWriter<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>::
FinalizeAnalyze(StandardColumnWriter<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>
                *this,ColumnWriterState *state_p)

{
  pointer val;
  byte bVar1;
  type tVar2;
  long lVar3;
  uint uVar4;
  
  tVar2 = ParquetWriter::GetType
                    ((this->super_PrimitiveColumnWriter).super_ColumnWriter.writer,
                     ((this->super_PrimitiveColumnWriter).super_ColumnWriter.column_schema)->
                     schema_index);
  val = state_p[2].definition_levels.super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  if ((val == (pointer)0x0) ||
     (*(char *)&state_p[3].repetition_levels.
                super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage == '\x01')) {
    PrimitiveDictionary<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>::Reset
              ((PrimitiveDictionary<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>
                *)&state_p[2].definition_levels);
    lVar3 = 0x188;
    uVar4 = 0;
    if ((((this->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->parquet_version != V1) &&
       (uVar4 = 0, tVar2 - INT32 < 6)) {
      uVar4 = *(uint *)(&DAT_02056d38 + (ulong)(tVar2 - INT32) * 4);
    }
  }
  else {
    bVar1 = RleBpDecoder::ComputeBitWidth((idx_t)val);
    uVar4 = (uint)bVar1;
    lVar3 = 0xe0;
  }
  *(uint *)((long)&state_p->_vptr_ColumnWriterState + lVar3) = uVar4;
  return;
}

Assistant:

void FinalizeAnalyze(ColumnWriterState &state_p) override {
		const auto type = writer.GetType(SchemaIndex());

		auto &state = state_p.Cast<StandardColumnWriterState<SRC, TGT, OP>>();
		if (state.dictionary.GetSize() == 0 || state.dictionary.IsFull()) {
			state.dictionary.Reset();
			if (writer.GetParquetVersion() == ParquetVersion::V1) {
				// Can't do the cool stuff for V1
				state.encoding = duckdb_parquet::Encoding::PLAIN;
			} else {
				// If we aren't doing dictionary encoding, these encodings are virtually always better than PLAIN
				switch (type) {
				case duckdb_parquet::Type::type::INT32:
				case duckdb_parquet::Type::type::INT64:
					state.encoding = duckdb_parquet::Encoding::DELTA_BINARY_PACKED;
					break;
				case duckdb_parquet::Type::type::BYTE_ARRAY:
					state.encoding = duckdb_parquet::Encoding::DELTA_LENGTH_BYTE_ARRAY;
					break;
				case duckdb_parquet::Type::type::FLOAT:
				case duckdb_parquet::Type::type::DOUBLE:
					state.encoding = duckdb_parquet::Encoding::BYTE_STREAM_SPLIT;
					break;
				default:
					state.encoding = duckdb_parquet::Encoding::PLAIN;
				}
			}
		} else {
			state.key_bit_width = RleBpDecoder::ComputeBitWidth(state.dictionary.GetSize());
		}
	}